

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_2d_avx2.h
# Opt level: O0

void convolve_2d_sr_ver_6tap_avx2
               (int16_t *im_block,int32_t w,int32_t h,InterpFilterParams *filter_params_y,
               int32_t subpel_y_q4,uint8_t *dst,int32_t dst_stride)

{
  __m128i res_00;
  __m256i res_01;
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  int in_EDX;
  int in_ESI;
  undefined1 (*in_RDI) [32];
  int in_R8D;
  long in_R9;
  undefined1 auVar43 [16];
  undefined1 auVar44 [32];
  undefined1 auVar45 [64];
  int in_stack_00000008;
  int16_t *s;
  __m256i r1 [4];
  __m256i r0 [4];
  __m256i tt_256_1 [2] [6];
  __m256i ss_256_4 [2] [6];
  __m256i s_256_3 [2] [6];
  int32_t x;
  __m256i r_2 [4];
  __m256i ss_256_3 [4];
  __m256i r_1 [4];
  __m256i tt_256 [6];
  __m256i ss_256_2 [6];
  __m256i s_256_2 [6];
  __m256i ss_256_1 [6];
  __m256i r [2];
  __m256i s_256_1 [6];
  __m256i res_1;
  __m256i ss_256 [3];
  __m256i s_256 [6];
  __m128i s_64 [6];
  __m256i coeffs_256 [3];
  __m128i res;
  __m128i src34;
  __m128i src23;
  __m128i src12;
  __m128i src01;
  __m128i ss_128 [3];
  __m128i s_32 [6];
  __m128i coeffs_128 [3];
  int32_t y;
  int16_t *im;
  __m128i *in_stack_ffffffffffffe678;
  undefined4 in_stack_ffffffffffffe680;
  int32_t in_stack_ffffffffffffe684;
  InterpFilterParams *in_stack_ffffffffffffe688;
  __m128i *in_stack_ffffffffffffe690;
  __m256i *in_stack_ffffffffffffe698;
  __m256i *in_stack_ffffffffffffe6a0;
  __m256i *in_stack_ffffffffffffe6a8;
  undefined4 in_stack_ffffffffffffe6b0;
  int32_t in_stack_ffffffffffffe6b4;
  InterpFilterParams *in_stack_ffffffffffffe6b8;
  __m256i *in_stack_ffffffffffffe6c0;
  __m128i *in_stack_ffffffffffffe6c8;
  int16_t *in_stack_ffffffffffffe6d0;
  __m256i *in_stack_ffffffffffffe718;
  __m256i *in_stack_ffffffffffffe720;
  __m256i *in_stack_ffffffffffffe728;
  int16_t *in_stack_ffffffffffffe730;
  undefined1 local_1880 [32];
  undefined1 local_1860 [32];
  undefined1 local_1820 [32];
  undefined1 local_1800 [32];
  undefined1 local_17c0 [32];
  undefined1 local_17a0 [32];
  undefined1 local_1760 [32];
  undefined1 local_1740 [32];
  undefined1 local_1700 [32];
  undefined1 local_16e0 [32];
  undefined1 local_16a0 [32];
  undefined1 local_1680 [32];
  undefined1 local_1640 [32];
  undefined1 local_1620 [32];
  undefined1 local_15e0 [32];
  undefined1 local_15c0 [32];
  undefined8 local_1580;
  undefined8 uStack_1578;
  undefined8 uStack_1570;
  undefined8 uStack_1568;
  undefined8 local_1560;
  undefined8 uStack_1558;
  undefined8 uStack_1550;
  undefined8 uStack_1548;
  undefined8 local_1540;
  undefined8 uStack_1538;
  undefined8 uStack_1530;
  undefined8 uStack_1528;
  undefined8 local_1520;
  undefined8 uStack_1518;
  undefined8 uStack_1510;
  undefined8 uStack_1508;
  undefined8 local_1500;
  undefined8 uStack_14f8;
  undefined8 uStack_14f0;
  undefined8 uStack_14e8;
  undefined8 local_14c0;
  undefined8 uStack_14b8;
  undefined8 uStack_14b0;
  undefined8 uStack_14a8;
  undefined8 local_14a0;
  undefined8 uStack_1498;
  undefined8 uStack_1490;
  undefined8 uStack_1488;
  undefined8 local_1480;
  undefined8 uStack_1478;
  undefined8 uStack_1470;
  undefined8 uStack_1468;
  undefined8 local_1460;
  undefined8 uStack_1458;
  undefined8 uStack_1450;
  undefined8 uStack_1448;
  undefined8 local_1440;
  undefined8 uStack_1438;
  undefined8 uStack_1430;
  undefined8 uStack_1428;
  int local_13e4;
  undefined1 local_1260 [32];
  undefined1 local_1240 [32];
  undefined1 local_1200 [32];
  undefined1 local_11e0 [32];
  undefined1 local_11a0 [32];
  undefined1 local_1180 [32];
  undefined1 local_1140 [32];
  undefined1 local_1120 [32];
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined8 uStack_10b0;
  undefined8 uStack_10a8;
  undefined8 local_10a0;
  undefined8 uStack_1098;
  undefined8 uStack_1090;
  undefined8 uStack_1088;
  undefined8 local_1080;
  undefined8 uStack_1078;
  undefined8 uStack_1070;
  undefined8 uStack_1068;
  undefined8 local_1060;
  undefined8 uStack_1058;
  undefined8 uStack_1050;
  undefined8 uStack_1048;
  undefined1 local_1020 [32];
  undefined1 local_1000 [32];
  undefined1 local_fc0 [32];
  undefined1 local_fa0 [32];
  undefined8 local_f20;
  undefined8 uStack_f18;
  undefined8 uStack_f10;
  undefined8 uStack_f08;
  undefined8 local_f00;
  undefined8 uStack_ef8;
  undefined8 uStack_ef0;
  undefined8 uStack_ee8;
  undefined8 local_ee0;
  undefined8 uStack_ed8;
  undefined8 uStack_ed0;
  undefined8 uStack_ec8;
  undefined8 local_ec0;
  undefined8 uStack_eb8;
  undefined8 uStack_eb0;
  undefined8 uStack_ea8;
  undefined1 local_e60 [32];
  undefined1 local_e40 [32];
  undefined1 local_e20 [32];
  ulong local_de0;
  undefined8 uStack_dd8;
  ulong uStack_dd0;
  undefined8 uStack_dc8;
  ulong local_dc0;
  undefined8 uStack_db8;
  ulong uStack_db0;
  undefined8 uStack_da8;
  ulong local_da0;
  undefined8 uStack_d98;
  ulong uStack_d90;
  undefined8 uStack_d88;
  ulong local_d80;
  undefined8 uStack_d78;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  ulong local_d20;
  undefined8 uStack_d18;
  ulong local_d10;
  undefined8 uStack_d08;
  ulong local_d00;
  undefined8 uStack_cf8;
  ulong local_cf0;
  undefined8 uStack_ce8;
  undefined8 local_ce0;
  undefined8 uStack_cd8;
  undefined1 local_c50 [16];
  undefined1 local_c40 [16];
  undefined1 local_c30 [16];
  undefined1 local_c20 [16];
  undefined1 local_c10 [16];
  undefined1 local_c00 [16];
  undefined1 local_bf0 [16];
  ulong local_bd0;
  undefined8 uStack_bc8;
  ulong local_bc0;
  undefined8 uStack_bb8;
  ulong local_bb0;
  undefined8 uStack_ba8;
  ulong local_ba0;
  undefined8 uStack_b98;
  ulong local_b90;
  undefined8 uStack_b88;
  int local_b34;
  undefined1 (*local_b30) [32];
  long local_b28;
  int local_b1c;
  int local_b10;
  int local_b0c;
  undefined1 local_b00 [16];
  uint local_ae4;
  undefined1 local_ae0 [16];
  uint local_ac4;
  undefined1 local_ac0 [16];
  uint local_aa4;
  undefined1 local_aa0 [16];
  uint local_a84;
  undefined1 local_a80 [16];
  uint local_a64;
  ulong local_a60;
  undefined8 uStack_a58;
  ulong local_a50;
  undefined8 uStack_a48;
  ulong local_a40;
  undefined8 uStack_a38;
  ulong local_a30;
  undefined8 uStack_a28;
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 uStack_a10;
  undefined8 uStack_a08;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 uStack_9d0;
  undefined8 uStack_9c8;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined8 uStack_990;
  undefined8 uStack_988;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 uStack_970;
  undefined8 uStack_968;
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 uStack_950;
  undefined8 uStack_948;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 uStack_930;
  undefined8 uStack_928;
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 uStack_910;
  undefined8 uStack_908;
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 uStack_8f0;
  undefined8 uStack_8e8;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  ulong local_8a0;
  undefined8 uStack_898;
  undefined8 uStack_890;
  undefined8 uStack_888;
  ulong local_880;
  undefined8 uStack_878;
  ulong uStack_870;
  undefined8 uStack_868;
  ulong local_860;
  undefined8 uStack_858;
  ulong uStack_850;
  undefined8 uStack_848;
  ulong local_840;
  undefined8 uStack_838;
  ulong uStack_830;
  undefined8 uStack_828;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 uStack_810;
  undefined8 uStack_808;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 uStack_7d0;
  undefined8 uStack_7c8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 uStack_7b0;
  undefined8 uStack_7a8;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 uStack_790;
  undefined8 uStack_788;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 uStack_710;
  undefined8 uStack_708;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  undefined1 (*local_698) [32];
  undefined1 (*local_690) [32];
  undefined1 (*local_688) [32];
  undefined1 (*local_680) [32];
  undefined1 (*local_678) [32];
  undefined1 (*local_670) [32];
  undefined1 (*local_668) [32];
  undefined1 (*local_660) [32];
  undefined1 (*local_658) [32];
  undefined8 local_650;
  undefined8 uStack_648;
  undefined1 (*local_638) [32];
  ulong local_630;
  undefined8 uStack_628;
  ulong *local_618;
  ulong local_610;
  undefined8 uStack_608;
  ulong *local_5f8;
  ulong local_5f0;
  undefined8 uStack_5e8;
  ulong *local_5d8;
  ulong local_5d0;
  undefined8 uStack_5c8;
  undefined1 (*local_5b8) [32];
  ulong local_5b0;
  undefined8 uStack_5a8;
  ulong local_5a0;
  undefined8 uStack_598;
  ulong local_590;
  undefined8 uStack_588;
  ulong local_580;
  undefined8 uStack_578;
  ulong local_570;
  undefined8 uStack_568;
  ulong local_560;
  undefined8 uStack_558;
  ulong local_550;
  undefined8 uStack_548;
  ulong local_540;
  undefined8 uStack_538;
  undefined8 local_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 local_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined1 *local_4e8;
  undefined1 *local_4e0;
  undefined8 *local_4d8;
  long local_4d0;
  undefined8 *local_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 uStack_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 *local_2b0;
  undefined8 *local_2a8;
  undefined8 *local_2a0;
  undefined8 *local_298;
  undefined8 *local_290;
  undefined1 *local_288;
  undefined1 *local_280;
  undefined8 *local_278;
  long local_270;
  undefined8 *local_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  undefined8 *local_58;
  undefined8 *local_50;
  undefined8 *local_48;
  undefined8 *local_40;
  undefined8 *local_38;
  
  local_b30 = in_RDI;
  local_b28 = in_R9;
  local_b10 = in_EDX;
  if (in_ESI == 2) {
    prepare_coeffs_6tap_ssse3
              (in_stack_ffffffffffffe688,in_stack_ffffffffffffe684,in_stack_ffffffffffffe678);
    local_a64 = *(uint *)*local_b30;
    local_a80._4_4_ = 0;
    local_a80._0_4_ = local_a64;
    local_bd0 = local_a80._0_8_;
    uStack_bc8 = 0;
    local_a84 = *(uint *)(*local_b30 + 4);
    local_aa0._4_4_ = 0;
    local_aa0._0_4_ = local_a84;
    local_bc0 = local_aa0._0_8_;
    uStack_bb8 = 0;
    local_aa4 = *(uint *)(*local_b30 + 8);
    local_ac0._4_4_ = 0;
    local_ac0._0_4_ = local_aa4;
    local_bb0 = local_ac0._0_8_;
    uStack_ba8 = 0;
    local_ac4 = *(uint *)(*local_b30 + 0xc);
    local_ae0._4_4_ = 0;
    local_ae0._0_4_ = local_ac4;
    local_ba0 = local_ae0._0_8_;
    uStack_b98 = 0;
    local_ae4 = *(uint *)(*local_b30 + 0x10);
    local_b00._4_4_ = 0;
    local_b00._0_4_ = local_ae4;
    local_b90 = local_b00._0_8_;
    uStack_b88 = 0;
    local_540 = local_a80._0_8_;
    uStack_538 = 0;
    local_550 = local_aa0._0_8_;
    uStack_548 = 0;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = local_a80._0_8_;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = local_aa0._0_8_;
    local_c10 = vpunpckldq_avx(auVar11,auVar10);
    local_560 = local_aa0._0_8_;
    uStack_558 = 0;
    local_570 = local_ac0._0_8_;
    uStack_568 = 0;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = local_aa0._0_8_;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = local_ac0._0_8_;
    local_c20 = vpunpckldq_avx(auVar9,auVar8);
    local_580 = local_ac0._0_8_;
    uStack_578 = 0;
    local_590 = local_ae0._0_8_;
    uStack_588 = 0;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = local_ac0._0_8_;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = local_ae0._0_8_;
    local_c30 = vpunpckldq_avx(auVar7,auVar6);
    local_5a0 = local_ae0._0_8_;
    uStack_598 = 0;
    local_5b0 = local_b00._0_8_;
    uStack_5a8 = 0;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = local_ae0._0_8_;
    auVar43._8_8_ = 0;
    auVar43._0_8_ = local_b00._0_8_;
    local_c40 = vpunpckldq_avx(auVar5,auVar43);
    local_500 = local_c10._0_8_;
    uStack_4f8 = local_c10._8_8_;
    local_510 = local_c20._0_8_;
    uStack_508 = local_c20._8_8_;
    local_c00 = vpunpcklwd_avx(local_c10,local_c20);
    local_520 = local_c30._0_8_;
    uStack_518 = local_c30._8_8_;
    local_530 = local_c40._0_8_;
    uStack_528 = local_c40._8_8_;
    local_bf0 = vpunpcklwd_avx(local_c30,local_c40);
    auVar45 = ZEXT1664(local_bf0);
    local_b34 = local_b10;
    local_b00 = ZEXT416(local_ae4);
    local_ae0 = ZEXT416(local_ac4);
    local_ac0 = ZEXT416(local_aa4);
    local_aa0 = ZEXT416(local_a84);
    local_a80 = ZEXT416(local_a64);
    do {
      auVar43 = auVar45._0_16_;
      xy_y_convolve_6tap_2x2_sse2
                ((int16_t *)in_stack_ffffffffffffe6a0,(__m128i *)in_stack_ffffffffffffe698,
                 in_stack_ffffffffffffe690,(__m128i *)in_stack_ffffffffffffe688);
      auVar45 = ZEXT1664(auVar43);
      res_00[1] = (longlong)in_stack_ffffffffffffe690;
      res_00[0] = (longlong)in_stack_ffffffffffffe688;
      local_c50 = auVar43;
      xy_y_round_store_2x2_sse2
                (res_00,(uint8_t *)CONCAT44(in_stack_ffffffffffffe684,in_stack_ffffffffffffe680),
                 (ptrdiff_t)in_stack_ffffffffffffe678);
      local_b30 = (undefined1 (*) [32])(*local_b30 + 8);
      local_b28 = local_b28 + (in_stack_00000008 << 1);
      local_b34 = local_b34 + -2;
    } while (local_b34 != 0);
  }
  else {
    local_b1c = in_R8D;
    local_b0c = in_ESI;
    prepare_coeffs_6tap_avx2
              (in_stack_ffffffffffffe6b8,in_stack_ffffffffffffe6b4,in_stack_ffffffffffffe6a8);
    if (local_b0c == 4) {
      local_5b8 = local_b30;
      local_de0 = *(ulong *)*local_b30;
      uStack_5c8 = 0;
      uStack_d18 = 0;
      local_5d8 = (ulong *)(*local_b30 + 8);
      uStack_dd0 = *local_5d8;
      uStack_5e8 = 0;
      uStack_d08 = 0;
      local_5f8 = (ulong *)(*local_b30 + 0x10);
      uStack_db0 = *local_5f8;
      uStack_608 = 0;
      uStack_cf8 = 0;
      local_618 = (ulong *)(*local_b30 + 0x18);
      uStack_d90 = *local_618;
      uStack_628 = 0;
      uStack_ce8 = 0;
      local_638 = local_b30 + 1;
      uStack_d70 = *(undefined8 *)*local_638;
      uStack_648 = 0;
      uStack_cd8 = 0;
      uStack_a28 = 0;
      uStack_dc8 = 0;
      uStack_dd8 = 0;
      uStack_a38 = 0;
      uStack_da8 = 0;
      uStack_db8 = 0;
      uStack_a48 = 0;
      uStack_d88 = 0;
      uStack_d98 = 0;
      uStack_a58 = 0;
      uStack_d68 = 0;
      uStack_d78 = 0;
      uStack_838 = 0;
      uStack_828 = 0;
      uStack_858 = 0;
      uStack_848 = 0;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = local_de0;
      auVar4._16_8_ = uStack_dd0;
      auVar4._24_8_ = 0;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = uStack_dd0;
      auVar3._16_8_ = uStack_db0;
      auVar3._24_8_ = 0;
      local_e40 = vpunpcklwd_avx2(auVar4,auVar3);
      uStack_878 = 0;
      uStack_868 = 0;
      uStack_898 = 0;
      uStack_888 = 0;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = uStack_db0;
      auVar2._16_8_ = uStack_d90;
      auVar2._24_8_ = 0;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = uStack_d90;
      auVar1._16_8_ = uStack_d70;
      auVar1._24_8_ = 0;
      local_e20 = vpunpcklwd_avx2(auVar2,auVar1);
      auVar45 = ZEXT3264(local_e20);
      local_b34 = local_b10;
      local_dc0 = uStack_dd0;
      local_da0 = uStack_db0;
      local_d80 = uStack_d90;
      local_d20 = local_de0;
      local_d10 = uStack_dd0;
      local_d00 = uStack_db0;
      local_cf0 = uStack_d90;
      local_ce0 = uStack_d70;
      local_a60 = uStack_d90;
      local_a50 = uStack_db0;
      local_a40 = uStack_dd0;
      local_a30 = local_de0;
      local_8a0 = uStack_d90;
      uStack_890 = uStack_d70;
      local_880 = uStack_db0;
      uStack_870 = uStack_d90;
      local_860 = uStack_dd0;
      uStack_850 = uStack_db0;
      local_840 = local_de0;
      uStack_830 = uStack_dd0;
      local_650 = uStack_d70;
      local_630 = uStack_d90;
      local_610 = uStack_db0;
      local_5f0 = uStack_dd0;
      local_5d0 = local_de0;
      do {
        auVar44 = auVar45._0_32_;
        xy_y_convolve_6tap_4x2_avx2
                  (in_stack_ffffffffffffe6d0,in_stack_ffffffffffffe6c8,in_stack_ffffffffffffe6c0,
                   (__m256i *)in_stack_ffffffffffffe6b8);
        auVar45 = ZEXT3264(auVar44);
        res_01[1] = (longlong)in_stack_ffffffffffffe6c0;
        res_01[0] = (longlong)in_stack_ffffffffffffe6b8;
        res_01[2] = (longlong)in_stack_ffffffffffffe6c8;
        res_01[3] = (longlong)in_stack_ffffffffffffe6d0;
        local_e60 = auVar44;
        xy_y_round_store_4x2_avx2
                  (res_01,(uint8_t *)CONCAT44(in_stack_ffffffffffffe6b4,in_stack_ffffffffffffe6b0),
                   (ptrdiff_t)in_stack_ffffffffffffe6a8);
        local_b30 = (undefined1 (*) [32])(*local_b30 + 0x10);
        local_b28 = local_b28 + (in_stack_00000008 << 1);
        local_b34 = local_b34 + -2;
      } while (local_b34 != 0);
    }
    else if (local_b0c == 8) {
      local_658 = local_b30;
      local_f20 = *(undefined8 *)*local_b30;
      uStack_f18 = *(undefined8 *)(*local_b30 + 8);
      uStack_f10 = *(undefined8 *)(*local_b30 + 0x10);
      uStack_f08 = *(undefined8 *)(*local_b30 + 0x18);
      local_660 = (undefined1 (*) [32])(*local_b30 + 0x10);
      local_f00 = *(undefined8 *)*local_660;
      uStack_ef8 = *(undefined8 *)(*local_b30 + 0x18);
      uStack_ef0 = *(undefined8 *)local_b30[1];
      uStack_ee8 = *(undefined8 *)(local_b30[1] + 8);
      local_668 = local_b30 + 1;
      local_ee0 = *(undefined8 *)*local_668;
      uStack_ed8 = *(undefined8 *)(local_b30[1] + 8);
      uStack_ed0 = *(undefined8 *)(local_b30[1] + 0x10);
      uStack_ec8 = *(undefined8 *)(local_b30[1] + 0x18);
      local_670 = (undefined1 (*) [32])(local_b30[1] + 0x10);
      local_ec0 = *(undefined8 *)*local_670;
      uStack_eb8 = *(undefined8 *)(local_b30[1] + 0x18);
      uStack_eb0 = *(undefined8 *)local_b30[2];
      uStack_ea8 = *(undefined8 *)(local_b30[2] + 8);
      local_b34 = local_b10;
      if (local_b1c == 8) {
        do {
          xy_y_convolve_6tap_8x2_half_pel_avx2
                    (in_stack_ffffffffffffe730,in_stack_ffffffffffffe728,in_stack_ffffffffffffe720,
                     in_stack_ffffffffffffe718);
          xy_y_round_store_8x2_avx2
                    (in_stack_ffffffffffffe6a0,(uint8_t *)in_stack_ffffffffffffe698,
                     (ptrdiff_t)in_stack_ffffffffffffe690);
          local_b30 = local_b30 + 1;
          local_b28 = local_b28 + (in_stack_00000008 << 1);
          local_b34 = local_b34 + -2;
        } while (local_b34 != 0);
      }
      else {
        local_1020 = vpunpcklwd_avx2(*local_b30,*local_660);
        local_1000 = vpunpcklwd_avx2(*local_668,*local_670);
        local_fc0 = vpunpckhwd_avx2(*local_b30,*local_660);
        local_fa0 = vpunpckhwd_avx2(*local_668,*local_670);
        local_920 = local_ec0;
        uStack_918 = uStack_eb8;
        uStack_910 = uStack_eb0;
        uStack_908 = uStack_ea8;
        local_900 = local_ee0;
        uStack_8f8 = uStack_ed8;
        uStack_8f0 = uStack_ed0;
        uStack_8e8 = uStack_ec8;
        local_8e0 = local_f00;
        uStack_8d8 = uStack_ef8;
        uStack_8d0 = uStack_ef0;
        uStack_8c8 = uStack_ee8;
        local_8c0 = local_f20;
        uStack_8b8 = uStack_f18;
        uStack_8b0 = uStack_f10;
        uStack_8a8 = uStack_f08;
        local_720 = local_ec0;
        uStack_718 = uStack_eb8;
        uStack_710 = uStack_eb0;
        uStack_708 = uStack_ea8;
        local_700 = local_ee0;
        uStack_6f8 = uStack_ed8;
        uStack_6f0 = uStack_ed0;
        uStack_6e8 = uStack_ec8;
        local_6e0 = local_f00;
        uStack_6d8 = uStack_ef8;
        uStack_6d0 = uStack_ef0;
        uStack_6c8 = uStack_ee8;
        local_6c0 = local_f20;
        uStack_6b8 = uStack_f18;
        uStack_6b0 = uStack_f10;
        uStack_6a8 = uStack_f08;
        do {
          xy_y_convolve_6tap_8x2_avx2
                    ((int16_t *)CONCAT44(in_stack_ffffffffffffe6b4,in_stack_ffffffffffffe6b0),
                     in_stack_ffffffffffffe6a8,in_stack_ffffffffffffe6a0,in_stack_ffffffffffffe698);
          xy_y_round_store_8x2_avx2
                    (in_stack_ffffffffffffe6a0,(uint8_t *)in_stack_ffffffffffffe698,
                     (ptrdiff_t)in_stack_ffffffffffffe690);
          local_b30 = local_b30 + 1;
          local_b28 = local_b28 + (in_stack_00000008 << 1);
          local_b34 = local_b34 + -2;
        } while (local_b34 != 0);
      }
    }
    else if (local_b0c == 0x10) {
      local_678 = local_b30;
      local_10e0 = *(undefined8 *)*local_b30;
      uStack_10d8 = *(undefined8 *)(*local_b30 + 8);
      uStack_10d0 = *(undefined8 *)(*local_b30 + 0x10);
      uStack_10c8 = *(undefined8 *)(*local_b30 + 0x18);
      local_680 = local_b30 + 1;
      local_10c0 = *(undefined8 *)*local_680;
      uStack_10b8 = *(undefined8 *)(local_b30[1] + 8);
      uStack_10b0 = *(undefined8 *)(local_b30[1] + 0x10);
      uStack_10a8 = *(undefined8 *)(local_b30[1] + 0x18);
      local_688 = local_b30 + 2;
      local_10a0 = *(undefined8 *)*local_688;
      uStack_1098 = *(undefined8 *)(local_b30[2] + 8);
      uStack_1090 = *(undefined8 *)(local_b30[2] + 0x10);
      uStack_1088 = *(undefined8 *)(local_b30[2] + 0x18);
      local_690 = local_b30 + 3;
      local_1080 = *(undefined8 *)*local_690;
      uStack_1078 = *(undefined8 *)(local_b30[3] + 8);
      uStack_1070 = *(undefined8 *)(local_b30[3] + 0x10);
      uStack_1068 = *(undefined8 *)(local_b30[3] + 0x18);
      local_698 = local_b30 + 4;
      local_1060 = *(undefined8 *)*local_698;
      uStack_1058 = *(undefined8 *)(local_b30[4] + 8);
      uStack_1050 = *(undefined8 *)(local_b30[4] + 0x10);
      uStack_1048 = *(undefined8 *)(local_b30[4] + 0x18);
      local_b34 = local_b10;
      if (local_b1c == 8) {
        do {
          xy_y_convolve_6tap_16x2_half_pel_avx2
                    (in_stack_ffffffffffffe6d0,(ptrdiff_t)in_stack_ffffffffffffe6c8,
                     in_stack_ffffffffffffe6c0,(__m256i *)in_stack_ffffffffffffe6b8,
                     (__m256i *)CONCAT44(in_stack_ffffffffffffe6b4,in_stack_ffffffffffffe6b0),
                     in_stack_ffffffffffffe6a8);
          xy_y_round_store_16x2_avx2
                    (in_stack_ffffffffffffe6c0,(uint8_t *)in_stack_ffffffffffffe6b8,
                     CONCAT44(in_stack_ffffffffffffe6b4,in_stack_ffffffffffffe6b0));
          local_b30 = local_b30 + 2;
          local_b28 = local_b28 + (in_stack_00000008 << 1);
          local_b34 = local_b34 + -2;
        } while (local_b34 != 0);
      }
      else {
        local_11a0 = vpunpcklwd_avx2(*local_b30,*local_680);
        local_1180 = vpunpcklwd_avx2(*local_688,*local_690);
        local_1140 = vpunpckhwd_avx2(*local_b30,*local_680);
        local_1120 = vpunpckhwd_avx2(*local_688,*local_690);
        local_1260 = vpunpcklwd_avx2(*local_680,*local_688);
        local_1240 = vpunpcklwd_avx2(*local_690,*local_698);
        local_1200 = vpunpckhwd_avx2(*local_680,*local_688);
        local_11e0 = vpunpckhwd_avx2(*local_690,*local_698);
        local_a20 = local_1060;
        uStack_a18 = uStack_1058;
        uStack_a10 = uStack_1050;
        uStack_a08 = uStack_1048;
        local_a00 = local_1080;
        uStack_9f8 = uStack_1078;
        uStack_9f0 = uStack_1070;
        uStack_9e8 = uStack_1068;
        local_9e0 = local_10a0;
        uStack_9d8 = uStack_1098;
        uStack_9d0 = uStack_1090;
        uStack_9c8 = uStack_1088;
        local_9c0 = local_10c0;
        uStack_9b8 = uStack_10b8;
        uStack_9b0 = uStack_10b0;
        uStack_9a8 = uStack_10a8;
        local_9a0 = local_1080;
        uStack_998 = uStack_1078;
        uStack_990 = uStack_1070;
        uStack_988 = uStack_1068;
        local_980 = local_10a0;
        uStack_978 = uStack_1098;
        uStack_970 = uStack_1090;
        uStack_968 = uStack_1088;
        local_960 = local_10c0;
        uStack_958 = uStack_10b8;
        uStack_950 = uStack_10b0;
        uStack_948 = uStack_10a8;
        local_940 = local_10e0;
        uStack_938 = uStack_10d8;
        uStack_930 = uStack_10d0;
        uStack_928 = uStack_10c8;
        local_820 = local_1060;
        uStack_818 = uStack_1058;
        uStack_810 = uStack_1050;
        uStack_808 = uStack_1048;
        local_800 = local_1080;
        uStack_7f8 = uStack_1078;
        uStack_7f0 = uStack_1070;
        uStack_7e8 = uStack_1068;
        local_7e0 = local_10a0;
        uStack_7d8 = uStack_1098;
        uStack_7d0 = uStack_1090;
        uStack_7c8 = uStack_1088;
        local_7c0 = local_10c0;
        uStack_7b8 = uStack_10b8;
        uStack_7b0 = uStack_10b0;
        uStack_7a8 = uStack_10a8;
        local_7a0 = local_1080;
        uStack_798 = uStack_1078;
        uStack_790 = uStack_1070;
        uStack_788 = uStack_1068;
        local_780 = local_10a0;
        uStack_778 = uStack_1098;
        uStack_770 = uStack_1090;
        uStack_768 = uStack_1088;
        local_760 = local_10c0;
        uStack_758 = uStack_10b8;
        uStack_750 = uStack_10b0;
        uStack_748 = uStack_10a8;
        local_740 = local_10e0;
        uStack_738 = uStack_10d8;
        uStack_730 = uStack_10d0;
        uStack_728 = uStack_10c8;
        do {
          xy_y_convolve_6tap_16x2_avx2();
          xy_y_round_store_16x2_avx2
                    (in_stack_ffffffffffffe6c0,(uint8_t *)in_stack_ffffffffffffe6b8,
                     CONCAT44(in_stack_ffffffffffffe6b4,in_stack_ffffffffffffe6b0));
          local_b30 = local_b30 + 2;
          local_b28 = local_b28 + (in_stack_00000008 << 1);
          local_b34 = local_b34 + -2;
        } while (local_b34 != 0);
      }
    }
    else {
      local_13e4 = 0;
      do {
        local_268 = (undefined8 *)(*local_b30 + (long)local_13e4 * 2);
        local_270 = (long)local_b0c;
        local_278 = &local_1580;
        local_280 = local_1700;
        local_288 = local_1880;
        local_40 = (undefined8 *)((long)local_268 + local_270 * 2);
        local_48 = (undefined8 *)((long)local_268 + local_270 * 4);
        local_50 = (undefined8 *)((long)local_268 + local_270 * 6);
        local_58 = local_268 + local_270;
        local_180 = local_1580;
        uStack_178 = uStack_1578;
        uStack_170 = uStack_1570;
        uStack_168 = uStack_1568;
        auVar44._8_8_ = uStack_1578;
        auVar44._0_8_ = local_1580;
        auVar44._16_8_ = uStack_1570;
        auVar44._24_8_ = uStack_1568;
        local_1a0 = local_1560;
        uStack_198 = uStack_1558;
        uStack_190 = uStack_1550;
        uStack_188 = uStack_1548;
        auVar12._8_8_ = uStack_1558;
        auVar12._0_8_ = local_1560;
        auVar12._16_8_ = uStack_1550;
        auVar12._24_8_ = uStack_1548;
        local_1700 = vpunpcklwd_avx2(auVar44,auVar12);
        local_1c0 = local_1540;
        uStack_1b8 = uStack_1538;
        uStack_1b0 = uStack_1530;
        uStack_1a8 = uStack_1528;
        auVar15._8_8_ = uStack_1538;
        auVar15._0_8_ = local_1540;
        auVar15._16_8_ = uStack_1530;
        auVar15._24_8_ = uStack_1528;
        local_1e0 = local_1520;
        uStack_1d8 = uStack_1518;
        uStack_1d0 = uStack_1510;
        uStack_1c8 = uStack_1508;
        auVar16._8_8_ = uStack_1518;
        auVar16._0_8_ = local_1520;
        auVar16._16_8_ = uStack_1510;
        auVar16._24_8_ = uStack_1508;
        local_16e0 = vpunpcklwd_avx2(auVar15,auVar16);
        local_80 = local_1580;
        uStack_78 = uStack_1578;
        uStack_70 = uStack_1570;
        uStack_68 = uStack_1568;
        auVar19._8_8_ = uStack_1578;
        auVar19._0_8_ = local_1580;
        auVar19._16_8_ = uStack_1570;
        auVar19._24_8_ = uStack_1568;
        local_a0 = local_1560;
        uStack_98 = uStack_1558;
        uStack_90 = uStack_1550;
        uStack_88 = uStack_1548;
        auVar20._8_8_ = uStack_1558;
        auVar20._0_8_ = local_1560;
        auVar20._16_8_ = uStack_1550;
        auVar20._24_8_ = uStack_1548;
        local_16a0 = vpunpckhwd_avx2(auVar19,auVar20);
        local_c0 = local_1540;
        uStack_b8 = uStack_1538;
        uStack_b0 = uStack_1530;
        uStack_a8 = uStack_1528;
        auVar23._8_8_ = uStack_1538;
        auVar23._0_8_ = local_1540;
        auVar23._16_8_ = uStack_1530;
        auVar23._24_8_ = uStack_1528;
        local_e0 = local_1520;
        uStack_d8 = uStack_1518;
        uStack_d0 = uStack_1510;
        uStack_c8 = uStack_1508;
        auVar24._8_8_ = uStack_1518;
        auVar24._0_8_ = local_1520;
        auVar24._16_8_ = uStack_1510;
        auVar24._24_8_ = uStack_1508;
        local_1680 = vpunpckhwd_avx2(auVar23,auVar24);
        local_200 = local_1560;
        uStack_1f8 = uStack_1558;
        uStack_1f0 = uStack_1550;
        uStack_1e8 = uStack_1548;
        auVar27._8_8_ = uStack_1558;
        auVar27._0_8_ = local_1560;
        auVar27._16_8_ = uStack_1550;
        auVar27._24_8_ = uStack_1548;
        local_220 = local_1540;
        uStack_218 = uStack_1538;
        uStack_210 = uStack_1530;
        uStack_208 = uStack_1528;
        auVar28._8_8_ = uStack_1538;
        auVar28._0_8_ = local_1540;
        auVar28._16_8_ = uStack_1530;
        auVar28._24_8_ = uStack_1528;
        local_1880 = vpunpcklwd_avx2(auVar27,auVar28);
        local_240 = local_1520;
        uStack_238 = uStack_1518;
        uStack_230 = uStack_1510;
        uStack_228 = uStack_1508;
        auVar31._8_8_ = uStack_1518;
        auVar31._0_8_ = local_1520;
        auVar31._16_8_ = uStack_1510;
        auVar31._24_8_ = uStack_1508;
        local_260 = local_1500;
        uStack_258 = uStack_14f8;
        uStack_250 = uStack_14f0;
        uStack_248 = uStack_14e8;
        auVar32._8_8_ = uStack_14f8;
        auVar32._0_8_ = local_1500;
        auVar32._16_8_ = uStack_14f0;
        auVar32._24_8_ = uStack_14e8;
        local_1860 = vpunpcklwd_avx2(auVar31,auVar32);
        local_100 = local_1560;
        uStack_f8 = uStack_1558;
        uStack_f0 = uStack_1550;
        uStack_e8 = uStack_1548;
        auVar35._8_8_ = uStack_1558;
        auVar35._0_8_ = local_1560;
        auVar35._16_8_ = uStack_1550;
        auVar35._24_8_ = uStack_1548;
        local_120 = local_1540;
        uStack_118 = uStack_1538;
        uStack_110 = uStack_1530;
        uStack_108 = uStack_1528;
        auVar36._8_8_ = uStack_1538;
        auVar36._0_8_ = local_1540;
        auVar36._16_8_ = uStack_1530;
        auVar36._24_8_ = uStack_1528;
        local_1820 = vpunpckhwd_avx2(auVar35,auVar36);
        local_140 = local_1520;
        uStack_138 = uStack_1518;
        uStack_130 = uStack_1510;
        uStack_128 = uStack_1508;
        auVar39._8_8_ = uStack_1518;
        auVar39._0_8_ = local_1520;
        auVar39._16_8_ = uStack_1510;
        auVar39._24_8_ = uStack_1508;
        local_160 = local_1500;
        uStack_158 = uStack_14f8;
        uStack_150 = uStack_14f0;
        uStack_148 = uStack_14e8;
        auVar40._8_8_ = uStack_14f8;
        auVar40._0_8_ = local_1500;
        auVar40._16_8_ = uStack_14f0;
        auVar40._24_8_ = uStack_14e8;
        local_1800 = vpunpckhwd_avx2(auVar39,auVar40);
        local_4c8 = local_268 + 4;
        local_4d0 = (long)local_b0c;
        local_4d8 = &local_14c0;
        local_4e0 = local_1640;
        local_4e8 = local_17c0;
        local_298 = (undefined8 *)((long)local_4c8 + local_4d0 * 2);
        local_2a0 = (undefined8 *)((long)local_4c8 + local_4d0 * 4);
        local_2a8 = (undefined8 *)((long)local_4c8 + local_4d0 * 6);
        local_2b0 = local_4c8 + local_4d0;
        local_3e0 = local_14c0;
        uStack_3d8 = uStack_14b8;
        uStack_3d0 = uStack_14b0;
        uStack_3c8 = uStack_14a8;
        auVar13._8_8_ = uStack_14b8;
        auVar13._0_8_ = local_14c0;
        auVar13._16_8_ = uStack_14b0;
        auVar13._24_8_ = uStack_14a8;
        local_400 = local_14a0;
        uStack_3f8 = uStack_1498;
        uStack_3f0 = uStack_1490;
        uStack_3e8 = uStack_1488;
        auVar14._8_8_ = uStack_1498;
        auVar14._0_8_ = local_14a0;
        auVar14._16_8_ = uStack_1490;
        auVar14._24_8_ = uStack_1488;
        local_1640 = vpunpcklwd_avx2(auVar13,auVar14);
        local_420 = local_1480;
        uStack_418 = uStack_1478;
        uStack_410 = uStack_1470;
        uStack_408 = uStack_1468;
        auVar17._8_8_ = uStack_1478;
        auVar17._0_8_ = local_1480;
        auVar17._16_8_ = uStack_1470;
        auVar17._24_8_ = uStack_1468;
        local_440 = local_1460;
        uStack_438 = uStack_1458;
        uStack_430 = uStack_1450;
        uStack_428 = uStack_1448;
        auVar18._8_8_ = uStack_1458;
        auVar18._0_8_ = local_1460;
        auVar18._16_8_ = uStack_1450;
        auVar18._24_8_ = uStack_1448;
        local_1620 = vpunpcklwd_avx2(auVar17,auVar18);
        local_2e0 = local_14c0;
        uStack_2d8 = uStack_14b8;
        uStack_2d0 = uStack_14b0;
        uStack_2c8 = uStack_14a8;
        auVar21._8_8_ = uStack_14b8;
        auVar21._0_8_ = local_14c0;
        auVar21._16_8_ = uStack_14b0;
        auVar21._24_8_ = uStack_14a8;
        local_300 = local_14a0;
        uStack_2f8 = uStack_1498;
        uStack_2f0 = uStack_1490;
        uStack_2e8 = uStack_1488;
        auVar22._8_8_ = uStack_1498;
        auVar22._0_8_ = local_14a0;
        auVar22._16_8_ = uStack_1490;
        auVar22._24_8_ = uStack_1488;
        local_15e0 = vpunpckhwd_avx2(auVar21,auVar22);
        local_320 = local_1480;
        uStack_318 = uStack_1478;
        uStack_310 = uStack_1470;
        uStack_308 = uStack_1468;
        auVar25._8_8_ = uStack_1478;
        auVar25._0_8_ = local_1480;
        auVar25._16_8_ = uStack_1470;
        auVar25._24_8_ = uStack_1468;
        local_340 = local_1460;
        uStack_338 = uStack_1458;
        uStack_330 = uStack_1450;
        uStack_328 = uStack_1448;
        auVar26._8_8_ = uStack_1458;
        auVar26._0_8_ = local_1460;
        auVar26._16_8_ = uStack_1450;
        auVar26._24_8_ = uStack_1448;
        local_15c0 = vpunpckhwd_avx2(auVar25,auVar26);
        local_460 = local_14a0;
        uStack_458 = uStack_1498;
        uStack_450 = uStack_1490;
        uStack_448 = uStack_1488;
        auVar29._8_8_ = uStack_1498;
        auVar29._0_8_ = local_14a0;
        auVar29._16_8_ = uStack_1490;
        auVar29._24_8_ = uStack_1488;
        local_480 = local_1480;
        uStack_478 = uStack_1478;
        uStack_470 = uStack_1470;
        uStack_468 = uStack_1468;
        auVar30._8_8_ = uStack_1478;
        auVar30._0_8_ = local_1480;
        auVar30._16_8_ = uStack_1470;
        auVar30._24_8_ = uStack_1468;
        local_17c0 = vpunpcklwd_avx2(auVar29,auVar30);
        local_4a0 = local_1460;
        uStack_498 = uStack_1458;
        uStack_490 = uStack_1450;
        uStack_488 = uStack_1448;
        auVar33._8_8_ = uStack_1458;
        auVar33._0_8_ = local_1460;
        auVar33._16_8_ = uStack_1450;
        auVar33._24_8_ = uStack_1448;
        local_4c0 = local_1440;
        uStack_4b8 = uStack_1438;
        uStack_4b0 = uStack_1430;
        uStack_4a8 = uStack_1428;
        auVar34._8_8_ = uStack_1438;
        auVar34._0_8_ = local_1440;
        auVar34._16_8_ = uStack_1430;
        auVar34._24_8_ = uStack_1428;
        local_17a0 = vpunpcklwd_avx2(auVar33,auVar34);
        local_360 = local_14a0;
        uStack_358 = uStack_1498;
        uStack_350 = uStack_1490;
        uStack_348 = uStack_1488;
        auVar37._8_8_ = uStack_1498;
        auVar37._0_8_ = local_14a0;
        auVar37._16_8_ = uStack_1490;
        auVar37._24_8_ = uStack_1488;
        local_380 = local_1480;
        uStack_378 = uStack_1478;
        uStack_370 = uStack_1470;
        uStack_368 = uStack_1468;
        auVar38._8_8_ = uStack_1478;
        auVar38._0_8_ = local_1480;
        auVar38._16_8_ = uStack_1470;
        auVar38._24_8_ = uStack_1468;
        local_1760 = vpunpckhwd_avx2(auVar37,auVar38);
        local_3a0 = local_1460;
        uStack_398 = uStack_1458;
        uStack_390 = uStack_1450;
        uStack_388 = uStack_1448;
        auVar41._8_8_ = uStack_1458;
        auVar41._0_8_ = local_1460;
        auVar41._16_8_ = uStack_1450;
        auVar41._24_8_ = uStack_1448;
        local_3c0 = local_1440;
        uStack_3b8 = uStack_1438;
        uStack_3b0 = uStack_1430;
        uStack_3a8 = uStack_1428;
        auVar42._8_8_ = uStack_1438;
        auVar42._0_8_ = local_1440;
        auVar42._16_8_ = uStack_1430;
        auVar42._24_8_ = uStack_1428;
        local_1740 = vpunpckhwd_avx2(auVar41,auVar42);
        local_b34 = local_b10;
        local_290 = local_4c8;
        local_38 = local_268;
        local_1580 = *local_268;
        uStack_1578 = local_268[1];
        uStack_1570 = local_268[2];
        uStack_1568 = local_268[3];
        local_14c0 = *local_4c8;
        uStack_14b8 = local_268[5];
        uStack_14b0 = local_268[6];
        uStack_14a8 = local_268[7];
        local_1560 = *local_40;
        uStack_1558 = local_40[1];
        uStack_1550 = local_40[2];
        uStack_1548 = local_40[3];
        local_14a0 = *local_298;
        uStack_1498 = local_298[1];
        uStack_1490 = local_298[2];
        uStack_1488 = local_298[3];
        local_1540 = *local_48;
        uStack_1538 = local_48[1];
        uStack_1530 = local_48[2];
        uStack_1528 = local_48[3];
        local_1480 = *local_2a0;
        uStack_1478 = local_2a0[1];
        uStack_1470 = local_2a0[2];
        uStack_1468 = local_2a0[3];
        local_1520 = *local_50;
        uStack_1518 = local_50[1];
        uStack_1510 = local_50[2];
        uStack_1508 = local_50[3];
        local_1460 = *local_2a8;
        uStack_1458 = local_2a8[1];
        uStack_1450 = local_2a8[2];
        uStack_1448 = local_2a8[3];
        local_1500 = *local_58;
        uStack_14f8 = local_58[1];
        uStack_14f0 = local_58[2];
        uStack_14e8 = local_58[3];
        local_1440 = *local_2b0;
        uStack_1438 = local_2b0[1];
        uStack_1430 = local_2b0[2];
        uStack_1428 = local_2b0[3];
        do {
          xy_y_convolve_6tap_16x2_avx2();
          xy_y_convolve_6tap_16x2_avx2();
          xy_y_round_store_32_avx2
                    (in_stack_ffffffffffffe6c0,(__m256i *)in_stack_ffffffffffffe6b8,
                     (uint8_t *)CONCAT44(in_stack_ffffffffffffe6b4,in_stack_ffffffffffffe6b0));
          xy_y_round_store_32_avx2
                    (in_stack_ffffffffffffe6c0,(__m256i *)in_stack_ffffffffffffe6b8,
                     (uint8_t *)CONCAT44(in_stack_ffffffffffffe6b4,in_stack_ffffffffffffe6b0));
          local_b34 = local_b34 + -2;
        } while (local_b34 != 0);
        local_13e4 = local_13e4 + 0x20;
      } while (local_13e4 < local_b0c);
    }
  }
  return;
}

Assistant:

static void convolve_2d_sr_ver_6tap_avx2(
    const int16_t *const im_block, const int32_t w, const int32_t h,
    const InterpFilterParams *const filter_params_y, const int32_t subpel_y_q4,
    uint8_t *dst, const int32_t dst_stride) {
  const int16_t *im = im_block;
  int32_t y;

  if (w == 2) {
    __m128i coeffs_128[3], s_32[6], ss_128[3];

    prepare_coeffs_6tap_ssse3(filter_params_y, subpel_y_q4, coeffs_128);

    s_32[0] = _mm_cvtsi32_si128(*(int32_t *)(im + 0 * 2));
    s_32[1] = _mm_cvtsi32_si128(*(int32_t *)(im + 1 * 2));
    s_32[2] = _mm_cvtsi32_si128(*(int32_t *)(im + 2 * 2));
    s_32[3] = _mm_cvtsi32_si128(*(int32_t *)(im + 3 * 2));
    s_32[4] = _mm_cvtsi32_si128(*(int32_t *)(im + 4 * 2));

    const __m128i src01 = _mm_unpacklo_epi32(s_32[0], s_32[1]);
    const __m128i src12 = _mm_unpacklo_epi32(s_32[1], s_32[2]);
    const __m128i src23 = _mm_unpacklo_epi32(s_32[2], s_32[3]);
    const __m128i src34 = _mm_unpacklo_epi32(s_32[3], s_32[4]);

    ss_128[0] = _mm_unpacklo_epi16(src01, src12);
    ss_128[1] = _mm_unpacklo_epi16(src23, src34);

    y = h;
    do {
      const __m128i res =
          xy_y_convolve_6tap_2x2_sse2(im, s_32, ss_128, coeffs_128);
      xy_y_round_store_2x2_sse2(res, dst, dst_stride);
      im += 2 * 2;
      dst += 2 * dst_stride;
      y -= 2;
    } while (y);
  } else {
    __m256i coeffs_256[3];

    prepare_coeffs_6tap_avx2(filter_params_y, subpel_y_q4, coeffs_256);

    if (w == 4) {
      __m128i s_64[6];
      __m256i s_256[6], ss_256[3];

      s_64[0] = _mm_loadl_epi64((__m128i *)(im + 0 * 4));
      s_64[1] = _mm_loadl_epi64((__m128i *)(im + 1 * 4));
      s_64[2] = _mm_loadl_epi64((__m128i *)(im + 2 * 4));
      s_64[3] = _mm_loadl_epi64((__m128i *)(im + 3 * 4));
      s_64[4] = _mm_loadl_epi64((__m128i *)(im + 4 * 4));

      // Load lines a and b. Line a to lower 128, line b to upper 128
      s_256[0] = _mm256_setr_m128i(s_64[0], s_64[1]);
      s_256[1] = _mm256_setr_m128i(s_64[1], s_64[2]);
      s_256[2] = _mm256_setr_m128i(s_64[2], s_64[3]);
      s_256[3] = _mm256_setr_m128i(s_64[3], s_64[4]);

      ss_256[0] = _mm256_unpacklo_epi16(s_256[0], s_256[1]);
      ss_256[1] = _mm256_unpacklo_epi16(s_256[2], s_256[3]);

      y = h;
      do {
        const __m256i res =
            xy_y_convolve_6tap_4x2_avx2(im, s_64, ss_256, coeffs_256);
        xy_y_round_store_4x2_avx2(res, dst, dst_stride);
        im += 2 * 4;
        dst += 2 * dst_stride;
        y -= 2;
      } while (y);
    } else if (w == 8) {
      __m256i s_256[6], r[2];

      s_256[0] = _mm256_loadu_si256((__m256i *)(im + 0 * 8));
      s_256[1] = _mm256_loadu_si256((__m256i *)(im + 1 * 8));
      s_256[2] = _mm256_loadu_si256((__m256i *)(im + 2 * 8));
      s_256[3] = _mm256_loadu_si256((__m256i *)(im + 3 * 8));
      y = h;

      if (subpel_y_q4 != 8) {
        __m256i ss_256[6];

        ss_256[0] = _mm256_unpacklo_epi16(s_256[0], s_256[1]);
        ss_256[1] = _mm256_unpacklo_epi16(s_256[2], s_256[3]);

        ss_256[3] = _mm256_unpackhi_epi16(s_256[0], s_256[1]);
        ss_256[4] = _mm256_unpackhi_epi16(s_256[2], s_256[3]);

        do {
          xy_y_convolve_6tap_8x2_avx2(im, ss_256, coeffs_256, r);
          xy_y_round_store_8x2_avx2(r, dst, dst_stride);
          im += 2 * 8;
          dst += 2 * dst_stride;
          y -= 2;
        } while (y);
      } else {
        do {
          xy_y_convolve_6tap_8x2_half_pel_avx2(im, coeffs_256, s_256, r);
          xy_y_round_store_8x2_avx2(r, dst, dst_stride);
          im += 2 * 8;
          dst += 2 * dst_stride;
          y -= 2;
        } while (y);
      }
    } else if (w == 16) {
      __m256i s_256[6];

      s_256[0] = _mm256_loadu_si256((__m256i *)(im + 0 * 16));
      s_256[1] = _mm256_loadu_si256((__m256i *)(im + 1 * 16));
      s_256[2] = _mm256_loadu_si256((__m256i *)(im + 2 * 16));
      s_256[3] = _mm256_loadu_si256((__m256i *)(im + 3 * 16));
      s_256[4] = _mm256_loadu_si256((__m256i *)(im + 4 * 16));
      y = h;

      if (subpel_y_q4 != 8) {
        __m256i ss_256[6], tt_256[6], r[4];

        ss_256[0] = _mm256_unpacklo_epi16(s_256[0], s_256[1]);
        ss_256[1] = _mm256_unpacklo_epi16(s_256[2], s_256[3]);
        ss_256[3] = _mm256_unpackhi_epi16(s_256[0], s_256[1]);
        ss_256[4] = _mm256_unpackhi_epi16(s_256[2], s_256[3]);

        tt_256[0] = _mm256_unpacklo_epi16(s_256[1], s_256[2]);
        tt_256[1] = _mm256_unpacklo_epi16(s_256[3], s_256[4]);
        tt_256[3] = _mm256_unpackhi_epi16(s_256[1], s_256[2]);
        tt_256[4] = _mm256_unpackhi_epi16(s_256[3], s_256[4]);

        do {
          xy_y_convolve_6tap_16x2_avx2(im, 16, s_256, ss_256, tt_256,
                                       coeffs_256, r);
          xy_y_round_store_16x2_avx2(r, dst, dst_stride);
          im += 2 * 16;
          dst += 2 * dst_stride;
          y -= 2;
        } while (y);
      } else {
        __m256i ss_256[4], r[4];

        do {
          xy_y_convolve_6tap_16x2_half_pel_avx2(im, 16, s_256, ss_256,
                                                coeffs_256, r);
          xy_y_round_store_16x2_avx2(r, dst, dst_stride);

          im += 2 * 16;
          dst += 2 * dst_stride;
          y -= 2;
        } while (y);
      }
    } else {
      int32_t x = 0;

      assert(!(w % 32));

      __m256i s_256[2][6], ss_256[2][6], tt_256[2][6], r0[4], r1[4];

      do {
        const int16_t *s = im + x;
        uint8_t *d = dst + x;

        loadu_unpack_16bit_5rows_avx2(s, w, s_256[0], ss_256[0], tt_256[0]);
        loadu_unpack_16bit_5rows_avx2(s + 16, w, s_256[1], ss_256[1],
                                      tt_256[1]);

        y = h;
        do {
          xy_y_convolve_6tap_16x2_avx2(s, w, s_256[0], ss_256[0], tt_256[0],
                                       coeffs_256, r0);
          xy_y_convolve_6tap_16x2_avx2(s + 16, w, s_256[1], ss_256[1],
                                       tt_256[1], coeffs_256, r1);

          xy_y_round_store_32_avx2(r0 + 0, r1 + 0, d);
          xy_y_round_store_32_avx2(r0 + 2, r1 + 2, d + dst_stride);

          s += 2 * w;
          d += 2 * dst_stride;
          y -= 2;
        } while (y);

        x += 32;
      } while (x < w);
    }
  }
}